

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

Data __thiscall
QDateTimePrivate::create
          (QDateTimePrivate *this,QDate toDate,QTime toTime,QTimeZone *zone,
          TransitionResolution resolve)

{
  undefined4 uVar1;
  int *piVar2;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve_00;
  uint uVar3;
  ulong uVar4;
  
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  uVar3 = *(int *)&zone->d - 1U & 3;
  if (uVar3 < 2) {
    uVar4 = (ulong)(uVar3 * 0x10 + 1);
    this->super_QSharedData = (QSharedData)(int)uVar4;
    this->m_status = (StatusFlags)(int)(uVar4 >> 0x20);
  }
  else {
    piVar2 = (int *)operator_new(0x20);
    piVar2[0] = 0;
    piVar2[1] = 0;
    piVar2[2] = 0;
    piVar2[3] = 0;
    piVar2[4] = 0;
    QTimeZone::QTimeZone((QTimeZone *)(piVar2 + 6));
    *(int **)this = piVar2;
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    *(uint *)(*(long *)this + 4) = uVar3 << 4;
    if (uVar3 == 3) {
      QTimeZone::operator=((QTimeZone *)(*(long *)this + 0x18),zone);
    }
    else if (uVar3 == 2) {
      uVar1 = (int)((ulong)(zone->d).d >> 2);
      if (((int)(zone->d).d - 1U & 3) != 2) {
        uVar1 = 0;
      }
      *(undefined4 *)(*(long *)this + 0x10) = uVar1;
    }
  }
  setDateTime((QDateTimeData *)this,toDate,toTime);
  if ((*(int *)&zone->d - 1U & 3) - 1 < 2) {
    refreshSimpleDateTime((QDateTimeData *)this);
  }
  else {
    resolve_00.i = 0;
    if (resolve - LegacyBehavior < 6) {
      resolve_00.i = *(Int *)(&DAT_0056e1bc + (ulong)(resolve - LegacyBehavior) * 4);
    }
    refreshZonedDateTime((QDateTimeData *)this,zone,(TransitionOptions)resolve_00.i);
  }
  return (Data)this;
}

Assistant:

Q_NEVER_INLINE
QDateTime::Data QDateTimePrivate::create(QDate toDate, QTime toTime, const QTimeZone &zone,
                                         QDateTime::TransitionResolution resolve)
{
    QDateTime::Data result(zone);
    setDateTime(result, toDate, toTime);
    if (zone.isUtcOrFixedOffset())
        refreshSimpleDateTime(result);
    else
        refreshZonedDateTime(result, zone, toTransitionOptions(resolve));
    return result;
}